

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall
discordpp::ThreadMetadata::ThreadMetadata
          (ThreadMetadata *this,field<bool> *archived,field<int> *auto_archive_duration,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *archive_timestamp,field<bool> *locked,omittable_field<bool> *invitable,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *create_timestamp)

{
  field<bool>::field(&this->archived,archived);
  field<int>::field(&this->auto_archive_duration,auto_archive_duration);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->archive_timestamp,archive_timestamp);
  field<bool>::field(&this->locked,locked);
  omittable_field<bool>::omittable_field(&this->invitable,invitable);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->create_timestamp,create_timestamp);
  return;
}

Assistant:

ThreadMetadata(
        field<bool> archived = uninitialized,
        field<int> auto_archive_duration = uninitialized,
        field<Timestamp> archive_timestamp = uninitialized,
        field<bool> locked = uninitialized,
        omittable_field<bool> invitable = omitted,
        nullable_omittable_field<Timestamp> create_timestamp = omitted
    ):
        archived(archived),
        auto_archive_duration(auto_archive_duration),
        archive_timestamp(archive_timestamp),
        locked(locked),
        invitable(invitable),
        create_timestamp(create_timestamp)
    {}